

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O1

bool jhu::thrax::isConsistent(Alignment *a,SpanPair sp)

{
  Point PVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer pPVar4;
  long lVar5;
  int iVar6;
  short sVar7;
  int iVar9;
  int iVar10;
  Span SStack_1e;
  int iVar8;
  
  pPVar4 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  SStack_1e = sp.src;
  lVar5 = (long)pPVar2 - (long)pPVar4 >> 4;
  iVar6 = (int)SStack_1e >> 0x10;
  sVar7 = sp.tgt.start;
  iVar8 = (int)sp.tgt >> 0x10;
  pPVar3 = pPVar4;
  if (0 < lVar5) {
    iVar9 = (int)SStack_1e * 0x10000;
    iVar10 = (int)sVar7;
    pPVar3 = (pointer)((long)&pPVar4->src + ((long)pPVar2 - (long)pPVar4 & 0xfffffffffffffff0U));
    lVar5 = lVar5 + 1;
    pPVar4 = pPVar4 + 2;
    do {
      PVar1 = pPVar4[-2];
      if (((int)PVar1 >> 0x10 < iVar8 && iVar10 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar6 && iVar9 <= (int)PVar1 * 0x10000)) {
        pPVar4 = pPVar4 + -2;
        goto LAB_00107b13;
      }
      PVar1 = pPVar4[-1];
      if (((int)PVar1 >> 0x10 < iVar8 && iVar10 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar6 && iVar9 <= (int)PVar1 * 0x10000)) {
        pPVar4 = pPVar4 + -1;
        goto LAB_00107b13;
      }
      PVar1 = *pPVar4;
      if (((int)PVar1 >> 0x10 < iVar8 && iVar10 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar6 && iVar9 <= (int)PVar1 * 0x10000)) goto LAB_00107b13;
      PVar1 = pPVar4[1];
      if (((int)PVar1 >> 0x10 < iVar8 && iVar10 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar6 && iVar9 <= (int)PVar1 * 0x10000)) {
        pPVar4 = pPVar4 + 1;
        goto LAB_00107b13;
      }
      lVar5 = lVar5 + -1;
      pPVar4 = pPVar4 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pPVar2 - (long)pPVar3 >> 2;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pPVar4 = pPVar2;
      if ((lVar5 != 3) ||
         (PVar1 = *pPVar3, pPVar4 = pPVar3,
         (PVar1.src < iVar6 && (int)SStack_1e * 0x10000 <= (int)PVar1 * 0x10000) !=
         ((int)PVar1 >> 0x10 < iVar8 && (int)sVar7 <= (int)PVar1 >> 0x10))) goto LAB_00107b13;
      pPVar3 = pPVar3 + 1;
    }
    PVar1 = *pPVar3;
    pPVar4 = pPVar3;
    if ((PVar1.src < iVar6 && (int)SStack_1e * 0x10000 <= (int)PVar1 * 0x10000) !=
        ((int)PVar1 >> 0x10 < iVar8 && (int)sVar7 <= (int)PVar1 >> 0x10)) goto LAB_00107b13;
    pPVar3 = pPVar3 + 1;
  }
  PVar1 = *pPVar3;
  pPVar4 = pPVar3;
  if (((int)PVar1 >> 0x10 < iVar8 && (int)sVar7 <= (int)PVar1 >> 0x10) ==
      (PVar1.src < iVar6 && (int)SStack_1e * 0x10000 <= (int)PVar1 * 0x10000)) {
    pPVar4 = pPVar2;
  }
LAB_00107b13:
  return pPVar4 == pPVar2;
}

Assistant:

bool isConsistent(const Alignment& a, SpanPair sp) {
  constexpr auto contains = [](IndexType p, Span s) {
    return p >= s.start && p < s.end;
  };
  return std::none_of(
      a.begin(),
      a.end(),
      [contains,sp](Point p) {
        return contains(p.src, sp.src) ^ contains(p.tgt, sp.tgt);
      });
}